

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O2

bool __thiscall
QOpenGLTextureBlitterPrivate::ensureProgram(QOpenGLTextureBlitterPrivate *this,ProgramIndex idx)

{
  long lVar1;
  ProgramIndex idx_00;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *fs;
  char *vs;
  pair<int,_int> *__x;
  long in_FS_OFFSET;
  pair<int,_int> local_40;
  pair<int,_int> local_38;
  QSurfaceFormat format;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  if (this->programs[idx].glProgram.d != (QOpenGLShaderProgram *)0x0) goto LAB_00159f09;
  lVar4 = QOpenGLContext::currentContext();
  if (lVar4 == 0) {
    bVar2 = false;
    goto LAB_00159f09;
  }
  __x = (pair<int,_int> *)&format;
  _format = (pair<int,_int>)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format();
  iVar3 = QSurfaceFormat::profile();
  if (iVar3 != 1) {
LAB_00159e9f:
    if (idx == TEXTURE_EXTERNAL_OES) {
      bVar2 = QOpenGLTextureBlitter::supportsExternalOESTarget((QOpenGLTextureBlitter *)__x);
      if (bVar2) {
        vs = 
        "attribute highp vec3 vertexCoord;attribute highp vec2 textureCoord;varying highp vec2 uv;uniform highp mat4 vertexTransform;uniform highp mat3 textureTransform;void main() {   uv = (textureTransform * vec3(textureCoord,1.0)).xy;   gl_Position = vertexTransform * vec4(vertexCoord,1.0);}"
        ;
        fs = 
        "#extension GL_OES_EGL_image_external : require\nvarying highp vec2 uv;uniform samplerExternalOES textureSampler;\nuniform bool swizzle;uniform highp float opacity;void main() {   highp vec4 tmpFragColor = texture2D(textureSampler, uv);   tmpFragColor.a *= opacity;   gl_FragColor = swizzle ? tmpFragColor.bgra : tmpFragColor;}"
        ;
        idx_00 = TEXTURE_EXTERNAL_OES;
        goto LAB_00159ee2;
      }
    }
    else if (idx == TEXTURE_RECTANGLE) {
      bVar2 = QOpenGLTextureBlitter::supportsRectangleTarget((QOpenGLTextureBlitter *)__x);
      if (bVar2) {
        vs = 
        "attribute highp vec3 vertexCoord;attribute highp vec2 textureCoord;varying highp vec2 uv;uniform highp mat4 vertexTransform;uniform highp mat3 textureTransform;void main() {   uv = (textureTransform * vec3(textureCoord,1.0)).xy;   gl_Position = vertexTransform * vec4(vertexCoord,1.0);}"
        ;
        fs = 
        "varying highp vec2 uv;uniform sampler2DRect textureSampler;uniform bool swizzle;uniform highp float opacity;void main() {   highp vec4 tmpFragColor = texture2DRect(textureSampler,uv);   tmpFragColor.a *= opacity;   gl_FragColor = swizzle ? tmpFragColor.bgra : tmpFragColor;}"
        ;
        goto LAB_00159ec0;
      }
    }
    goto LAB_00159eef;
  }
  local_38 = (pair<int,_int>)QSurfaceFormat::version();
  __x = &local_38;
  local_40.first = 3;
  local_40.second = 2;
  bVar2 = std::operator>=(__x,&local_40);
  if (!bVar2) goto LAB_00159e9f;
  if (idx == TEXTURE_RECTANGLE) {
    bVar2 = QOpenGLTextureBlitter::supportsRectangleTarget((QOpenGLTextureBlitter *)__x);
    if (!bVar2) goto LAB_00159eef;
    vs = 
    "#version 150 core\nin vec3 vertexCoord;in vec2 textureCoord;out vec2 uv;uniform mat4 vertexTransform;uniform mat3 textureTransform;void main() {   uv = (textureTransform * vec3(textureCoord,1.0)).xy;   gl_Position = vertexTransform * vec4(vertexCoord,1.0);}"
    ;
    fs = 
    "#version 150 core\nin vec2 uv;out vec4 fragcolor;uniform sampler2DRect textureSampler;uniform bool swizzle;uniform float opacity;void main() {   vec4 tmpFragColor = texture(textureSampler, uv);   tmpFragColor.a *= opacity;   fragcolor = swizzle ? tmpFragColor.bgra : tmpFragColor;}"
    ;
LAB_00159ec0:
    idx_00 = TEXTURE_RECTANGLE;
LAB_00159ee2:
    bVar2 = buildProgram(this,idx_00,vs,fs);
    if (bVar2) goto LAB_00159eef;
    bVar2 = false;
  }
  else {
LAB_00159eef:
    bVar2 = this->programs[idx].glProgram.d != (QOpenGLShaderProgram *)0x0;
  }
  QSurfaceFormat::~QSurfaceFormat(&format);
LAB_00159f09:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLTextureBlitterPrivate::ensureProgram(ProgramIndex idx)
{
    if (programs[idx].glProgram)
        return true;

    QOpenGLContext *currentContext = QOpenGLContext::currentContext();
    if (!currentContext)
        return false;

    QSurfaceFormat format = currentContext->format();
    if (format.profile() == QSurfaceFormat::CoreProfile && format.version() >= std::pair(3,2)) {
        if (idx == QOpenGLTextureBlitterPrivate::TEXTURE_RECTANGLE && q->supportsRectangleTarget()) {
            if (!buildProgram(idx, vertex_shader150, fragment_shader150_rectangle))
                return false;
        }
    } else {
        if (idx == QOpenGLTextureBlitterPrivate::TEXTURE_RECTANGLE && q->supportsRectangleTarget()) {
            if (!buildProgram(idx, vertex_shader, fragment_shader_rectangle))
                return false;
        }
        if (idx == QOpenGLTextureBlitterPrivate::TEXTURE_EXTERNAL_OES && q->supportsExternalOESTarget()) {
            if (!buildProgram(idx, vertex_shader, fragment_shader_external_oes))
                return false;
        }
    }

    return !programs[idx].glProgram.isNull();
}